

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

decimal_fp<float> fmt::v8::detail::dragonbox::to_decimal<float>(float x)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  char cVar10;
  carrier_uint two_f;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  
  uVar9 = (uint)x & 0x7fffff;
  if (((uint)x & 0x7f800000) == 0) {
    uVar8 = 0xffffff6b;
    if (uVar9 == 0) {
      uVar13 = 0;
      uVar9 = 0;
      goto LAB_0012cb70;
    }
LAB_0012c897:
    uVar12 = (int)(uVar8 * 0x134413) >> 0x16;
    uVar13 = (ulong)uVar12;
    uVar1 = *(ulong *)(cache_accessor<float>::get_cached_power(int)::pow10_significands +
                      (ulong)(0x20 - uVar12) * 8);
    bVar4 = (char)((int)((1 - uVar12) * 0x1a934f) >> 0x13) + (char)uVar8;
    iVar11 = uVar12 - 1;
    uVar5 = uVar9 * 2;
    two_f = uVar9 * 2 + 1;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar1;
    auVar2 = ZEXT416(two_f << (bVar4 & 0x1f)) * auVar2;
    uVar7 = (auVar2._8_8_ & 0xffffffff) / 100;
    uVar6 = (uint)uVar7;
    uVar15 = uVar6 * -100 + auVar2._8_4_;
    uVar14 = (uint)(uVar1 >> (~bVar4 & 0x3f));
    if (uVar15 <= uVar14) {
      if (uVar15 < uVar14) {
        if ((((uVar9 & 1) == 0) || (uVar15 != 0)) ||
           (bVar3 = is_endpoint_integer<float>(two_f,uVar8,iVar11), !bVar3)) {
LAB_0012cada:
          iVar11 = uVar12 + 1;
          uVar8 = 0;
          if ((uVar6 | 0x80) != 0) {
            for (; ((uVar6 | 0x80) >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
            }
          }
          uVar9 = 0;
          while ((uVar15 = (uint)uVar7, uVar5 = uVar8 & 0xfffffffe, (int)uVar9 < (int)(uVar8 - 1) &&
                 (uVar5 = uVar9, uVar15 * -0x3d70a3d7 < 0xa3d70a4))) {
            uVar9 = uVar9 + 2;
            uVar7 = (ulong)(uVar15 * -0x3d70a3d7);
          }
          goto LAB_0012cb52;
        }
        uVar6 = uVar6 - 1;
        uVar15 = 100;
      }
      else if ((((uVar9 & 1) == 0) &&
               (bVar3 = is_endpoint_integer<float>(uVar5 - 1,uVar8,iVar11), bVar3)) ||
              (((uVar5 - 1) * uVar1 >> ((ulong)(byte)(0x40 - bVar4) & 0x3f) & 1) != 0))
      goto LAB_0012cada;
    }
    uVar9 = (uVar15 - (uVar14 >> 1)) + 5;
    if ((uVar9 & 1) == 0) {
      uVar15 = (uVar9 >> 1) * 0xcccd;
      uVar9 = (uVar15 >> 0x12) + uVar6 * 10;
      if ((uVar15 & 0xfffc) < 0x3334) {
        if ((uVar1 * uVar5 >> ((ulong)(byte)(0x40 - bVar4) & 0x3f) & 1) == 0) {
          uVar9 = uVar9 - 1;
        }
        else {
          bVar3 = is_center_integer<float>(uVar5,uVar8,iVar11);
          if (bVar3) {
            uVar9 = uVar9 & 0xfffffffe;
          }
        }
      }
    }
    else {
      uVar9 = (uVar9 * 0xcccd >> 0x13) + uVar6 * 10;
    }
  }
  else {
    uVar8 = (((uint)x & 0x7f800000) >> 0x17) - 0x96;
    if (uVar9 != 0) {
      uVar9 = uVar9 | 0x800000;
      goto LAB_0012c897;
    }
    uVar15 = (int)(uVar8 * 0x134413 + -0x7feff) >> 0x16;
    uVar13 = (ulong)uVar15;
    cVar10 = (char)((int)(uVar15 * -0x1a934f) >> 0x13) + (char)uVar8;
    uVar1 = *(ulong *)(cache_accessor<float>::get_cached_power(int)::pow10_significands +
                      (ulong)(0x1f - uVar15) * 8);
    bVar4 = 0x28 - cVar10;
    uVar5 = (uint)((uVar8 & 0xfffffffe) != 2) + (int)(uVar1 - (uVar1 >> 0x19) >> (bVar4 & 0x3f));
    uVar9 = 0;
    uVar7 = ((uVar1 >> 0x18) + uVar1 >> (bVar4 & 0x3f) & 0xffffffff) / 10;
    if ((uint)uVar7 * 10 < uVar5) {
      uVar9 = (int)(uVar1 >> (0x27U - cVar10 & 0x3f)) + 1U >> 1;
      if (uVar8 == 0xffffffdd) {
        uVar9 = uVar9 & 0xfffffffe;
      }
      else {
        uVar9 = uVar9 + (uVar9 < uVar5);
      }
      goto LAB_0012cb70;
    }
    iVar11 = uVar15 + 1;
    uVar5 = (uint)uVar7 | 0x80;
    uVar8 = 0;
    if (uVar5 != 0) {
      for (; (uVar5 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
      }
    }
    while ((uVar15 = (uint)uVar7, uVar5 = uVar8 & 0xfffffffe, (int)uVar9 < (int)(uVar8 - 1) &&
           (uVar5 = uVar9, uVar15 * -0x3d70a3d7 < 0xa3d70a4))) {
      uVar9 = uVar9 + 2;
      uVar7 = (ulong)(uVar15 * -0x3d70a3d7);
    }
LAB_0012cb52:
    if (uVar5 < uVar8) {
      uVar9 = uVar15 * -0x33333333;
      if (uVar9 < 0x33333334) {
        uVar15 = uVar9;
      }
      uVar5 = uVar5 | uVar9 < 0x33333334;
    }
    uVar13 = (ulong)(iVar11 + uVar5);
    uVar9 = uVar15 >> ((byte)uVar5 & 0x1f);
  }
LAB_0012cb70:
  return (decimal_fp<float>)((ulong)uVar9 | uVar13 << 0x20);
}

Assistant:

FMT_CONSTEXPR fp normalize(fp value) {
  // Handle subnormals.
  const uint64_t implicit_bit = 1ULL << num_significand_bits<double>();
  const auto shifted_implicit_bit = implicit_bit << SHIFT;
  while ((value.f & shifted_implicit_bit) == 0) {
    value.f <<= 1;
    --value.e;
  }
  // Subtract 1 to account for hidden bit.
  const auto offset =
      fp::num_significand_bits - num_significand_bits<double>() - SHIFT - 1;
  value.f <<= offset;
  value.e -= offset;
  return value;
}